

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferTextureBufferRange::cleanIteration(TextureBufferTextureBufferRange *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  TextureBufferTextureBufferRange *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x1680))(0);
  (**(code **)(lVar4 + 0x40))(0x8892,0);
  (**(code **)(lVar4 + 0x48))(0x90d2,0);
  (**(code **)(lVar4 + 0x48))(0x90d2,1,0);
  (**(code **)(lVar4 + 0x48))(0x8c8e,0);
  (**(code **)(lVar4 + 0x48))(0x8c8e,1,0);
  (**(code **)(lVar4 + 0xb8))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Error reseting GLES state after iteration!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x314);
  if (this->m_vsfs_po_id != 0) {
    (**(code **)(lVar4 + 0x448))(this->m_vsfs_po_id);
    this->m_vsfs_po_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar4 + 0x470))(this->m_vs_id);
    this->m_vs_id = 0;
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar4 + 0x470))(this->m_fs_id);
    this->m_fs_id = 0;
  }
  if (this->m_tf_size_buffer_id != 0) {
    (**(code **)(lVar4 + 0x438))(1,&this->m_tf_size_buffer_id);
    this->m_tf_size_buffer_id = 0;
  }
  if (this->m_tf_value_buffer_id != 0) {
    (**(code **)(lVar4 + 0x438))(1,&this->m_tf_value_buffer_id);
    this->m_tf_value_buffer_id = 0;
  }
  if (this->m_cs_po_id != 0) {
    (**(code **)(lVar4 + 0x448))(this->m_cs_po_id);
    this->m_cs_po_id = 0;
  }
  if (this->m_cs_id != 0) {
    (**(code **)(lVar4 + 0x470))(this->m_cs_id);
    this->m_cs_id = 0;
  }
  if (this->m_ssbo_size_id != 0) {
    (**(code **)(lVar4 + 0x438))(1,&this->m_ssbo_size_id);
    this->m_ssbo_size_id = 0;
  }
  if (this->m_ssbo_value_id != 0) {
    (**(code **)(lVar4 + 0x438))(1,&this->m_ssbo_value_id);
    this->m_ssbo_value_id = 0;
  }
  if (this->m_tbo_tex_id != 0) {
    (**(code **)(lVar4 + 0x480))(1,&this->m_tbo_tex_id);
    this->m_tbo_tex_id = 0;
  }
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Error removing iteration resources!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x353);
  return;
}

Assistant:

void TextureBufferTextureBufferRange::cleanIteration()
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES state */
	gl.useProgram(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, 0);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, 0);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, 0);
	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error reseting GLES state after iteration!");

	/* Delete GLES objects */
	if (0 != m_vsfs_po_id)
	{
		gl.deleteProgram(m_vsfs_po_id);
		m_vsfs_po_id = 0;
	}

	if (0 != m_vs_id)
	{
		gl.deleteShader(m_vs_id);
		m_vs_id = 0;
	}

	if (0 != m_fs_id)
	{
		gl.deleteShader(m_fs_id);
		m_fs_id = 0;
	}

	if (0 != m_tf_size_buffer_id)
	{
		gl.deleteBuffers(1, &m_tf_size_buffer_id);
		m_tf_size_buffer_id = 0;
	}

	if (0 != m_tf_value_buffer_id)
	{
		gl.deleteBuffers(1, &m_tf_value_buffer_id);
		m_tf_value_buffer_id = 0;
	}

	if (0 != m_cs_po_id)
	{
		gl.deleteProgram(m_cs_po_id);
		m_cs_po_id = 0;
	}

	if (0 != m_cs_id)
	{
		gl.deleteShader(m_cs_id);
		m_cs_id = 0;
	}

	if (0 != m_ssbo_size_id)
	{
		gl.deleteBuffers(1, &m_ssbo_size_id);
		m_ssbo_size_id = 0;
	}

	if (0 != m_ssbo_value_id)
	{
		gl.deleteBuffers(1, &m_ssbo_value_id);
		m_ssbo_value_id = 0;
	}

	if (0 != m_tbo_tex_id)
	{
		gl.deleteTextures(1, &m_tbo_tex_id);
		m_tbo_tex_id = 0;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error removing iteration resources!");
}